

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O1

char * get_frame_type_as_string(AMQP_VALUE descriptor)

{
  _Bool _Var1;
  char *pcVar2;
  
  _Var1 = is_sasl_mechanisms_type_by_descriptor(descriptor);
  if (_Var1) {
    pcVar2 = "[SASL MECHANISMS]";
  }
  else {
    _Var1 = is_sasl_init_type_by_descriptor(descriptor);
    if (_Var1) {
      pcVar2 = "[SASL INIT]";
    }
    else {
      _Var1 = is_sasl_challenge_type_by_descriptor(descriptor);
      if (_Var1) {
        pcVar2 = "[SASL CHALLENGE]";
      }
      else {
        _Var1 = is_sasl_response_type_by_descriptor(descriptor);
        if (_Var1) {
          pcVar2 = "[SASL RESPONSE]";
        }
        else {
          _Var1 = is_sasl_outcome_type_by_descriptor(descriptor);
          pcVar2 = "[Unknown]";
          if (_Var1) {
            pcVar2 = "[SASL OUTCOME]";
          }
        }
      }
    }
  }
  return pcVar2;
}

Assistant:

static const char* get_frame_type_as_string(AMQP_VALUE descriptor)
{
    const char* result;

    if (is_sasl_mechanisms_type_by_descriptor(descriptor))
    {
        result = "[SASL MECHANISMS]";
    }
    else if (is_sasl_init_type_by_descriptor(descriptor))
    {
        result = "[SASL INIT]";
    }
    else if (is_sasl_challenge_type_by_descriptor(descriptor))
    {
        result = "[SASL CHALLENGE]";
    }
    else if (is_sasl_response_type_by_descriptor(descriptor))
    {
        result = "[SASL RESPONSE]";
    }
    else if (is_sasl_outcome_type_by_descriptor(descriptor))
    {
        result = "[SASL OUTCOME]";
    }
    else
    {
        result = "[Unknown]";
    }

    return result;
}